

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O0

int ffgmul(fitsfile *mfptr,int rmopt,int *status)

{
  int iVar1;
  size_t sVar2;
  bool bVar3;
  fitsfile *local_9c0;
  fitsfile *gfptr;
  char card [81];
  char local_958 [8];
  char keyword [75];
  char memberExtname [71];
  char local_8b8 [8];
  char memberHDUtype [71];
  char local_868 [8];
  char mbrLocation2 [1025];
  char local_458 [8];
  char mbrLocation1 [1025];
  long memberID;
  long memberExtver;
  long ngroups;
  long index;
  int iomode;
  int memberPosition;
  int *status_local;
  fitsfile *pfStack_18;
  int rmopt_local;
  fitsfile *mfptr_local;
  
  index._4_4_ = 0;
  memberExtver = 0;
  memberID = 0;
  stack0xffffffffffffffb0 = 0;
  local_9c0 = (fitsfile *)0x0;
  if (*status == 0) {
    _iomode = status;
    status_local._4_4_ = rmopt;
    pfStack_18 = mfptr;
    iVar1 = ffgkys(mfptr,"XTENSION",local_8b8,(char *)&gfptr,status);
    *_iomode = iVar1;
    if (*_iomode == 0xca) {
      strcpy(local_8b8,"PRIMARY");
      *_iomode = 0;
    }
    prepare_keyvalue(local_8b8);
    iVar1 = ffgkyj(pfStack_18,"EXTVER",&memberID,(char *)&gfptr,_iomode);
    *_iomode = iVar1;
    if (*_iomode == 0xca) {
      memberID = 1;
      *_iomode = 0;
    }
    iVar1 = ffgkys(pfStack_18,"EXTNAME",keyword + 0x48,(char *)&gfptr,_iomode);
    *_iomode = iVar1;
    if (*_iomode == 0xca) {
      keyword[0x48] = '\0';
      *_iomode = 0;
    }
    prepare_keyvalue(keyword + 0x48);
    ffghdn(pfStack_18,(int *)((long)&index + 4));
    iVar1 = fits_get_url(pfStack_18,local_458,local_868,(char *)0x0,(char *)0x0,(int *)0x0,_iomode);
    *_iomode = iVar1;
    if (*_iomode == 0) {
      iVar1 = ffgmng(pfStack_18,&memberExtver,_iomode);
      *_iomode = iVar1;
      ngroups = 1;
      while( true ) {
        bVar3 = false;
        if (ngroups <= memberExtver) {
          bVar3 = *_iomode == 0;
        }
        if (!bVar3) break;
        iVar1 = ffgtop(pfStack_18,(int)ngroups,&local_9c0,_iomode);
        *_iomode = iVar1;
        if (*_iomode == 0) {
          ffflmd(local_9c0,(int *)&index,_iomode);
          if ((int)index == 1) {
            stack0xffffffffffffffb0 = 0;
            sVar2 = strlen(local_458);
            if (sVar2 != 0) {
              iVar1 = ffgmf(local_9c0,local_8b8,keyword + 0x48,(int)memberID,index._4_4_,local_458,
                            (long *)(mbrLocation1 + 0x400),_iomode);
              *_iomode = iVar1;
            }
            if ((*_iomode == 0x156) && (sVar2 = strlen(local_868), sVar2 != 0)) {
              *_iomode = 0;
              iVar1 = ffgmf(local_9c0,local_8b8,keyword + 0x48,(int)memberID,index._4_4_,local_868,
                            (long *)(mbrLocation1 + 0x400),_iomode);
              *_iomode = iVar1;
            }
            if (*_iomode == 0) {
              iVar1 = ffdrow(local_9c0,stack0xffffffffffffffb0,1,_iomode);
              *_iomode = iVar1;
            }
            if (*_iomode == 0x156) {
              ffpmsg("cannot locate member\'s entry in group table (ffgmul)");
            }
            *_iomode = 0;
            if (local_9c0 != (fitsfile *)0x0) {
              ffclos(local_9c0,_iomode);
              local_9c0 = (fitsfile *)0x0;
            }
          }
          else {
            snprintf((char *)&gfptr,0x51,"The %dth group cannot be modified (ffgtam)",
                     ngroups & 0xffffffff);
            ffpmsg((char *)&gfptr);
          }
        }
        else {
          *_iomode = 0;
          snprintf((char *)&gfptr,0x51,"Cannot open the %dth group table (ffgmul)",
                   ngroups & 0xffffffff);
          ffpmsg((char *)&gfptr);
        }
        ngroups = ngroups + 1;
      }
      if ((*_iomode == 0) && (status_local._4_4_ != 0)) {
        ffflmd(pfStack_18,(int *)&index,_iomode);
        if ((int)index == 0) {
          ffpmsg("Cannot modify member HDU, opened READONLY (ffgmul)");
        }
        else {
          ngroups = 1;
          while( true ) {
            bVar3 = false;
            if (ngroups <= memberExtver) {
              bVar3 = *_iomode == 0;
            }
            if (!bVar3) break;
            snprintf(local_958,0x4b,"GRPID%d",ngroups & 0xffffffff);
            ffdkey(pfStack_18,local_958,_iomode);
            snprintf(local_958,0x4b,"GRPLC%d",ngroups & 0xffffffff);
            ffdkey(pfStack_18,local_958,_iomode);
            if (*_iomode == 0xca) {
              *_iomode = 0;
            }
            ngroups = ngroups + 1;
          }
        }
      }
    }
    if (local_9c0 != (fitsfile *)0x0) {
      ffclos(local_9c0,_iomode);
    }
    mfptr_local._4_4_ = *_iomode;
  }
  else {
    mfptr_local._4_4_ = *status;
  }
  return mfptr_local._4_4_;
}

Assistant:

int ffgmul(fitsfile *mfptr,   /* pointer to the grouping table member HDU    */
           int       rmopt,   /* 0 ==> leave GRPIDn/GRPLCn keywords,
				 1 ==> remove GRPIDn/GRPLCn keywords         */
	   int      *status) /* return status code                          */

/*
   examine all the GRPIDn and GRPLCn keywords in the member HDUs header
   and remove the member from the grouping tables referenced; This
   effectively "unlinks" the member from all of its groups. The rmopt 
   specifies if the GRPIDn/GRPLCn keywords are to be removed from the
   member HDUs header after the unlinking.
*/

{
  int memberPosition = 0;
  int iomode;

  long index;
  long ngroups      = 0;
  long memberExtver = 0;
  long memberID     = 0;

  char mbrLocation1[FLEN_FILENAME];
  char mbrLocation2[FLEN_FILENAME];
  char memberHDUtype[FLEN_VALUE];
  char memberExtname[FLEN_VALUE];
  char keyword[FLEN_KEYWORD];
  char card[FLEN_CARD];

  fitsfile *gfptr = NULL;


  if(*status != 0) return(*status);

  do
    {
      /* 
	 determine location parameters of the member HDU; note that
	 default values are supplied if the expected keywords are not
	 found
      */

      *status = fits_read_key_str(mfptr,"XTENSION",memberHDUtype,card,status);

      if(*status == KEY_NO_EXIST) 
	{
	  strcpy(memberHDUtype,"PRIMARY");
	  *status = 0;
	}
      prepare_keyvalue(memberHDUtype);

      *status = fits_read_key_lng(mfptr,"EXTVER",&memberExtver,card,status);

      if(*status == KEY_NO_EXIST) 
	{
	  memberExtver = 1;
	  *status      = 0;
	}

      *status = fits_read_key_str(mfptr,"EXTNAME",memberExtname,card,status);

      if(*status == KEY_NO_EXIST) 
	{
	  memberExtname[0] = 0;
	  *status          = 0;
	}
      prepare_keyvalue(memberExtname);

      fits_get_hdu_num(mfptr,&memberPosition);

      *status = fits_get_url(mfptr,mbrLocation1,mbrLocation2,NULL,NULL,
			     NULL,status);

      if(*status != 0) continue;

      /*
	 open each grouping table linked to this HDU and remove the member 
	 from the grouping tables
      */

      *status = fits_get_num_groups(mfptr,&ngroups,status);

      /* loop over each group linked to the member HDU */

      for(index = 1; index <= ngroups && *status == 0; ++index)
	{
	  /* open the (index)th group linked to the member HDU */ 

	  *status = fits_open_group(mfptr,index,&gfptr,status);

	  /* if the group could not be opened then just skip it */

	  if(*status != 0)
	    {
	      *status = 0;
	      snprintf(card,FLEN_CARD,"Cannot open the %dth group table (ffgmul)",
		      (int)index);
	      ffpmsg(card);
	      continue;
	    }

	  /*
	    make sure the grouping table can be modified before proceeding
	  */
	  
	  fits_file_mode(gfptr,&iomode,status);

	  if(iomode != READWRITE)
	    {
	      snprintf(card,FLEN_CARD,"The %dth group cannot be modified (ffgtam)",
		      (int)index);
	      ffpmsg(card);
	      continue;
	    }

	  /* 
	     try to find the member's row within the grouping table; first 
	     try using the member HDU file's "real" URL string then try
	     using its originally opened URL string if either string exist
	   */
	     
	  memberID = 0;
 
	  if(strlen(mbrLocation1) != 0)
	    {
	      *status = ffgmf(gfptr,memberHDUtype,memberExtname,memberExtver,
			      memberPosition,mbrLocation1,&memberID,status);
	    }

	  if(*status == MEMBER_NOT_FOUND && strlen(mbrLocation2) != 0)
	    {
	      *status = 0;
	      *status = ffgmf(gfptr,memberHDUtype,memberExtname,memberExtver,
			      memberPosition,mbrLocation2,&memberID,status);
	    }

	  /* if the member was found then delete it from the grouping table */

	  if(*status == 0)
	    *status = fits_delete_rows(gfptr,memberID,1,status);

	  /*
	     continue the loop over all member groups even if an error
	     was generated
	  */

	  if(*status == MEMBER_NOT_FOUND)
	    {
	      ffpmsg("cannot locate member's entry in group table (ffgmul)");
	    }
	  *status = 0;

	  /*
	     close the file pointed to by gfptr if it is non NULL to
	     prepare for the next loop iterration
	  */

	  if(gfptr != NULL)
	    {
	      fits_close_file(gfptr,status);
	      gfptr = NULL;
	    }
	}

      if(*status != 0) continue;

      /*
	 if rmopt is non-zero then find and delete the GRPIDn/GRPLCn 
	 keywords from the member HDU header
      */

      if(rmopt != 0)
	{
	  fits_file_mode(mfptr,&iomode,status);

	  if(iomode == READONLY)
	    {
	      ffpmsg("Cannot modify member HDU, opened READONLY (ffgmul)");
	      continue;
	    }

	  /* delete all the GRPIDn/GRPLCn keywords */

	  for(index = 1; index <= ngroups && *status == 0; ++index)
	    {
	      snprintf(keyword,FLEN_KEYWORD,"GRPID%d",(int)index);
	      fits_delete_key(mfptr,keyword,status);
	      
	      snprintf(keyword,FLEN_KEYWORD,"GRPLC%d",(int)index);
	      fits_delete_key(mfptr,keyword,status);

	      if(*status == KEY_NO_EXIST) *status = 0;
	    }
	}
    }while(0);

  /* make sure the gfptr has been closed */

  if(gfptr != NULL)
    { 
      fits_close_file(gfptr,status);
    }

return(*status);
}